

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioUtil.c
# Opt level: O2

Abc_Obj_t * Io_ReadCreateInv(Abc_Ntk_t *pNtk,char *pNameIn,char *pNameOut)

{
  Abc_Obj_t *pAVar1;
  Abc_Obj_t *pObj;
  
  pAVar1 = Abc_NtkFindNet(pNtk,pNameIn);
  if (pAVar1 == (Abc_Obj_t *)0x0) {
    __assert_fail("pNet",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioUtil.c"
                  ,0x30f,"Abc_Obj_t *Io_ReadCreateInv(Abc_Ntk_t *, char *, char *)");
  }
  pAVar1 = Abc_NtkCreateNodeInv(pNtk,pAVar1);
  pObj = Abc_NtkFindNet(pNtk,pNameOut);
  if (pObj != (Abc_Obj_t *)0x0) {
    Abc_ObjAddFanin(pObj,pAVar1);
    return pAVar1;
  }
  __assert_fail("pNet",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioUtil.c"
                ,0x311,"Abc_Obj_t *Io_ReadCreateInv(Abc_Ntk_t *, char *, char *)");
}

Assistant:

Abc_Obj_t * Io_ReadCreateInv( Abc_Ntk_t * pNtk, char * pNameIn, char * pNameOut )
{
    Abc_Obj_t * pNet, * pNode;
    pNet  = Abc_NtkFindNet(pNtk, pNameIn);     assert( pNet );
    pNode = Abc_NtkCreateNodeInv(pNtk, pNet);
    pNet  = Abc_NtkFindNet(pNtk, pNameOut);    assert( pNet );
    Abc_ObjAddFanin( pNet, pNode );
    return pNode;
}